

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_read_subregion_image(nifti_image *nim,int *start_index,int *region_size,void **data)

{
  ulong uVar1;
  znzFile fp;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  int rs [7];
  int si [7];
  int strides [7];
  int collapsed_dims [8];
  int local_108;
  int local_104;
  uint local_100;
  int local_fc [4];
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_d8 [4];
  uint local_c8 [4];
  long local_b8;
  int local_ac;
  uint local_a8;
  uint local_a4 [7];
  uint local_88;
  int local_84 [9];
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  znzFile local_38;
  
  uVar8 = nim->ndim;
  uVar9 = (ulong)uVar8;
  if (0 < (long)(int)uVar8) {
    uVar3 = 0;
    do {
      if ((start_index[uVar3] == 0) && (region_size[uVar3] == nim->dim[uVar3 + 1])) {
        local_84[uVar3] = -1;
      }
      else if (region_size[uVar3] == 1) {
        local_84[uVar3] = start_index[uVar3];
      }
      else {
        local_84[uVar3] = -2;
      }
      uVar3 = uVar3 + 1;
    } while (uVar9 != uVar3);
  }
  local_88 = uVar8;
  if ((int)uVar8 < 7) {
    memset(local_84 + (int)uVar8,0xff,(ulong)(6 - uVar8) * 4 + 4);
  }
  bVar10 = (int)uVar8 < 1;
  if (0 < (int)uVar8) {
    if (local_84[0] != -2) {
      uVar3 = 0;
      do {
        if (uVar9 - 1 == uVar3) goto LAB_00112668;
        uVar1 = uVar3 + 1;
        lVar4 = uVar3 + 1;
        uVar3 = uVar1;
      } while (local_84[lVar4] != -2);
      bVar10 = uVar9 <= uVar1;
    }
    if (!bVar10) {
      uVar9 = 0;
      do {
        if (nim->dim[uVar9 + 1] < region_size[uVar9] + start_index[uVar9]) {
          if (g_opts_0 < 2) {
            return -1;
          }
          nifti_read_subregion_image_cold_1();
          return -1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      local_38 = nifti_image_load_prep(nim);
      local_40 = znztell(local_38);
      local_a8 = nim->nbyper;
      lVar4 = 9;
      uVar8 = local_a8;
      do {
        uVar8 = uVar8 * nim->dim[lVar4 + -8];
        local_c8[lVar4] = uVar8;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xf);
      iVar2 = nim->ndim;
      lVar4 = (long)iVar2;
      uVar8 = local_a8;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          uVar8 = uVar8 * region_size[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      if (*data == (void *)0x0) {
        pvVar6 = malloc((long)(int)uVar8);
        *data = pvVar6;
      }
      pvVar6 = *data;
      if ((pvVar6 == (void *)0x0) && (1 < g_opts_0)) {
        fprintf(_stderr,"allocation of %d bytes failed\n",(ulong)uVar8);
        return -1;
      }
      if (0 < iVar2) {
        memcpy(local_d8,start_index,lVar4 * 4);
        memcpy(local_fc + 1,region_size,lVar4 * 4);
      }
      if (iVar2 < 7) {
        memset(local_d8 + lVar4,0,(ulong)(6 - iVar2) * 4 + 4);
        do {
          lVar4 = lVar4 + 1;
          local_fc[lVar4] = 1;
        } while ((int)lVar4 != 7);
      }
      bVar10 = 0 < local_e0;
      if (local_e0 < 1) {
        local_b8 = 0;
      }
      else {
        local_108 = local_c8[2];
        local_b8 = 0;
        do {
          if (0 < local_e4) {
            local_104 = local_c8[1];
            local_60 = (long)local_108;
            do {
              if (0 < local_e8) {
                local_100 = local_c8[0];
                local_58 = (long)local_104;
                do {
                  if (0 < local_ec) {
                    local_fc[0] = local_d8[3];
                    local_50 = (long)(int)local_100;
                    do {
                      if (0 < local_fc[3]) {
                        local_48 = (long)local_fc[0];
                        local_ac = local_d8[2];
                        do {
                          if (0 < local_fc[2]) {
                            lVar4 = (long)local_ac;
                            iVar2 = local_d8[1];
                            do {
                              fp = local_38;
                              znzseek(local_38,(long)(int)local_a8 * (long)local_d8[0] +
                                               (long)iVar2 * (long)(int)local_a4[0] +
                                               (int)local_a4[1] * lVar4 +
                                               (int)local_a4[2] * local_48 +
                                               (int)local_a4[3] * local_50 +
                                               (int)local_a4[4] * local_58 +
                                               (int)local_a4[5] * local_60 + local_40,0);
                              uVar9 = (long)nim->nbyper * (long)local_fc[1];
                              sVar7 = nifti_read_buffer(fp,pvVar6,uVar9,nim);
                              if (1 < g_opts_0 && (int)uVar9 != (int)sVar7) {
                                fprintf(_stderr,"read of %d bytes failed\n",uVar9 & 0xffffffff);
                                goto LAB_00112a09;
                              }
                              local_b8 = local_b8 + (int)sVar7;
                              pvVar6 = (void *)((long)pvVar6 + uVar9);
                              iVar2 = iVar2 + 1;
                            } while (iVar2 < local_fc[2] + local_d8[1]);
                          }
                          local_ac = local_ac + 1;
                        } while (local_ac < local_fc[3] + local_d8[2]);
                      }
                      local_fc[0] = local_fc[0] + 1;
                    } while (local_fc[0] < local_ec + local_d8[3]);
                  }
                  local_100 = local_100 + 1;
                } while ((int)local_100 < (int)(local_e8 + local_c8[0]));
              }
              local_104 = local_104 + 1;
            } while (local_104 < (int)(local_e4 + local_c8[1]));
          }
          local_108 = local_108 + 1;
          bVar10 = local_108 < (int)(local_e0 + local_c8[2]);
        } while (local_108 < (int)(local_e0 + local_c8[2]));
      }
LAB_00112a09:
      if (bVar10) {
        return -1;
      }
      return (int)local_b8;
    }
  }
LAB_00112668:
  iVar2 = nifti_read_collapsed_image(nim,(int *)&local_88,data);
  return iVar2;
}

Assistant:

int nifti_read_subregion_image( nifti_image * nim,
                                int *start_index,
                                int *region_size,
                                void ** data )
{
  znzFile fp;                   /* file to read */
  int i,j,k,l,m,n;              /* indices for dims */
  long int bytes = 0;           /* total # bytes read */
  int total_alloc_size;         /* size of buffer allocation */
  char *readptr;                /* where in *data to read next */
  int strides[7];               /* strides between dimensions */
  int collapsed_dims[8];        /* for read_collapsed_image */
  int *image_size;              /* pointer to dimensions in header */
  long int initial_offset;
  long int offset;              /* seek offset for reading current row */

  /* probably ignored, but set to ndim for consistency*/
  collapsed_dims[0] = nim->ndim;

  /* build a dims array for collapsed image read */
  for(i = 0; i < nim->ndim; i++)
    {
    /* if you take the whole extent in this dimension */
    if(start_index[i] == 0 &&
       region_size[i] == nim->dim[i+1])
      {
      collapsed_dims[i+1] = -1;
      }
    /* if you specify a single element in this dimension */
    else if(region_size[i] == 1)
      {
      collapsed_dims[i+1] = start_index[i];
      }
    else
      {
      collapsed_dims[i+1] = -2; /* sentinel value */
      }
    }
  /* fill out end of collapsed_dims */
  for(i = nim->ndim ; i < 7; i++)
    {
    collapsed_dims[i+1] = -1;
    }

  /* check to see whether collapsed read is possible */
  for(i = 1; i <= nim->ndim; i++)
    {
    if(collapsed_dims[i] == -2)
      {
      break;
      }
    }

  /* if you get through all the dimensions without hitting
  ** a subrange of size > 1, a collapsed read is possible
  */
  if(i > nim->ndim)
    {
    return nifti_read_collapsed_image(nim, collapsed_dims, data);
    }

  /* point past first element of dim, which holds nim->ndim */
  image_size = &(nim->dim[1]);

  /* check region sizes for sanity */
  for(i = 0; i < nim->ndim; i++)
    {
    if(start_index[i]  + region_size[i] > image_size[i])
      {
      if(g_opts.debug > 1)
        {
        fprintf(stderr,"region doesn't fit within image size\n");
        }
      return -1;
      }
    }

  /* get the file open */
  fp = nifti_image_load_prep( nim );
  /* the current offset is just past the nifti header, save
   * location so that SEEK_SET can be used below
   */
  initial_offset = znztell(fp);
  /* get strides*/
  compute_strides(strides,image_size,nim->nbyper);

  total_alloc_size = nim->nbyper; /* size of pixel */

  /* find alloc size */
  for(i = 0; i < nim->ndim; i++)
    {
    total_alloc_size *= region_size[i];
    }
  /* allocate buffer, if necessary */
  if(*data == 0)
    {
    *data = (void *)malloc(total_alloc_size);
    }

  if(*data == 0)
    {
    if(g_opts.debug > 1)
      {
      fprintf(stderr,"allocation of %d bytes failed\n",total_alloc_size);
      return -1;
      }
    }

  /* point to start of data buffer as char * */
  readptr = *((char **)data);
  {
  /* can't assume that start_index and region_size have any more than
  ** nim->ndim elements so make local copies, filled out to seven elements
  */
  int si[7], rs[7];
  for(i = 0; i < nim->ndim; i++)
    {
    si[i] = start_index[i];
    rs[i] = region_size[i];
    }
  for(i = nim->ndim; i < 7; i++)
    {
    si[i] = 0;
    rs[i] = 1;
    }
  /* loop through subregion and read a row at a time */
  for(i = si[6]; i < (si[6] + rs[6]); i++)
    {
    for(j = si[5]; j < (si[5] + rs[5]); j++)
      {
      for(k = si[4]; k < (si[4] + rs[4]); k++)
        {
        for(l = si[3]; l < (si[3] + rs[3]); l++)
          {
          for(m = si[2]; m < (si[2] + rs[2]); m++)
            {
            for(n = si[1]; n < (si[1] + rs[1]); n++)
              {
              int nread,read_amount;
              offset = initial_offset +
                (i * strides[6]) +
                (j * strides[5]) +
                (k * strides[4]) +
                (l * strides[3]) +
                (m * strides[2]) +
                (n * strides[1]) +
                (si[0] * strides[0]);
              znzseek(fp, offset, SEEK_SET); /* seek to current row */
              read_amount = rs[0] * nim->nbyper; /* read a row of the subregion*/
              nread = (int)nifti_read_buffer(fp, readptr, read_amount, nim);
              if(nread != read_amount)
                {
                if(g_opts.debug > 1)
                  {
                  fprintf(stderr,"read of %d bytes failed\n",read_amount);
                  return -1;
                  }
                }
              bytes += nread;
              readptr += read_amount;
              }
            }
          }
        }
      }
    }
  }
  return bytes;
}